

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objinfo.cpp
# Opt level: O0

bool findSymbolForName(symbol_section_accessor syms,Elf64_Addr *value,Elf_Half *section_index,
                      string *name)

{
  __type _Var1;
  Elf_Xword EVar2;
  ulong local_78;
  Elf_Xword i;
  Elf_Xword numSymbols;
  string candidateName;
  uchar other;
  uchar type;
  uchar bind;
  Elf_Xword size;
  string *name_local;
  Elf_Half *section_index_local;
  Elf64_Addr *value_local;
  
  size = (Elf_Xword)name;
  name_local = (string *)section_index;
  section_index_local = (Elf_Half *)value;
  std::__cxx11::string::string((string *)&numSymbols);
  EVar2 = ELFIO::symbol_section_accessor::get_symbols_num(&syms);
  local_78 = 0;
  do {
    if (EVar2 <= local_78) {
      value_local._7_1_ = 0;
LAB_00122bfc:
      std::__cxx11::string::~string((string *)&numSymbols);
      return (bool)(value_local._7_1_ & 1);
    }
    ELFIO::symbol_section_accessor::get_symbol
              (&syms,local_78,(string *)&numSymbols,(Elf64_Addr *)section_index_local,
               (Elf_Xword *)&stack0xffffffffffffffd0,
               (uchar *)(candidateName.field_2._M_local_buf + 0xf),
               (uchar *)(candidateName.field_2._M_local_buf + 0xe),(Elf_Half *)name_local,
               (uchar *)(candidateName.field_2._M_local_buf + 0xd));
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &numSymbols,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            size);
    if (_Var1) {
      value_local._7_1_ = 1;
      goto LAB_00122bfc;
    }
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

bool findSymbolForName(ELFIO::symbol_section_accessor syms, ELFIO::Elf64_Addr &value, ELFIO::Elf_Half &section_index, std::string &name)
{
	ELFIO::Elf_Xword size;
	unsigned char bind;
	unsigned char type;
	unsigned char other;
	std::string candidateName;

	ELFIO::Elf_Xword numSymbols = syms.get_symbols_num();
	for(ELFIO::Elf_Xword i = 0; i < numSymbols; i++) {
		syms.get_symbol(i, candidateName, value, size, bind, type, section_index, other);
		if(candidateName == name) {
			return true;
		}
	}

	return false;
}